

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorList.cpp
# Opt level: O2

void __thiscall Hpipe::Provenance::Provenance(Provenance *this,char *beg,char *pos)

{
  int iVar1;
  byte *pbVar2;
  char *pcVar3;
  byte *pbVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (this->complete_line)._M_dataplus._M_p = (pointer)&(this->complete_line).field_2;
  (this->complete_line)._M_string_length = 0;
  (this->complete_line).field_2._M_local_buf[0] = '\0';
  pcVar3 = pos;
  if (beg == (char *)0x0) {
    this->col = 0;
    this->line = 0;
  }
  else {
    for (; ((beg <= pcVar3 && (*pcVar3 != '\n')) && (*pcVar3 != '\r')); pcVar3 = pcVar3 + -1) {
    }
    pbVar2 = (byte *)pos;
    while ((0xd < *pbVar2 || ((0x2401U >> (*pbVar2 & 0x1f) & 1) == 0))) {
      pbVar2 = pbVar2 + 1;
    }
    pbVar4 = (byte *)(pcVar3 + 1);
    if (pbVar2 < pcVar3 + 1) {
      pbVar4 = pbVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pbVar4);
    std::__cxx11::string::operator=((string *)this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    this->col = ((int)pos - (int)pbVar4) + 1;
    this->line = 1;
    iVar1 = 1;
    for (; beg <= pos; pos = pos + -1) {
      iVar1 = iVar1 + (uint)(*pos == '\n');
      this->line = iVar1;
    }
  }
  return;
}

Assistant:

Provenance( const char *beg, const char *pos ) {
        if ( not beg ) {
            col  = 0;
            line = 0;
            return;
        }

        const char *b = pos, *e = pos;
        while ( b >= beg and *b != '\n' and *b != '\r' )
            --b;
        ++b;
        while ( *e and *e != '\n' and *e != '\r' )
            ++e;
        if ( b > e )
            b = e;

        complete_line = std::string( b, e );

        col = pos - b + 1;
        line = 1;
        for ( b = pos; b >= beg; --b )
            line += ( *b == '\n' );
    }